

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<char8_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *pbVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> it;
  bool local_271;
  int local_250;
  int local_24c;
  undefined1 local_229;
  int local_228;
  char8_t local_221;
  anon_class_56_7_162c6e41 local_220;
  float_specs local_1e8;
  bool local_1dd;
  int local_1dc;
  undefined1 auStack_1d8 [3];
  bool pointy;
  int num_zeros;
  significand_type *local_1d0;
  sign_t *local_1c8;
  int *local_1c0;
  char8_t *local_1b8;
  digit_grouping<char8_t> *local_1b0;
  int *local_1a8;
  char8_t *local_1a0;
  float_specs local_198;
  decimal_fp<float> *local_190;
  undefined1 local_188 [8];
  digit_grouping<char8_t> grouping_1;
  undefined1 auStack_158 [4];
  int num_zeros_3;
  significand_type *local_150;
  sign_t *local_148;
  basic_format_specs<char8_t> *local_140;
  digit_grouping<char8_t> *local_138;
  locale_ref *local_130;
  char8_t *local_128;
  char8_t *local_120;
  char8_t *local_118;
  float_specs local_110;
  decimal_fp<float> *local_f8;
  undefined1 local_f0 [8];
  digit_grouping<char8_t> grouping;
  int num_zeros_2;
  int exp;
  undefined1 local_9c [8];
  anon_class_28_8_ad0ecca5 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  char8_t local_51;
  size_t sStack_50;
  char8_t decimal_point;
  size_t size;
  sign_t sign;
  significand_type sStack_3c;
  char8_t zero;
  int significand_size;
  significand_type significand;
  basic_format_specs<char8_t> *specs_local;
  decimal_fp<float> *fp_local;
  locale_ref loc_local;
  float_specs fspecs_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_local;
  
  sStack_3c = fp->significand;
  _significand_size = specs;
  specs_local = (basic_format_specs<char8_t> *)fp;
  fp_local = (decimal_fp<float> *)loc.locale_;
  loc_local.locale_ = (void *)fspecs;
  fspecs_local = (float_specs)out.container;
  sign = get_significand_size<float>(fp);
  size._7_1_ = 0x30;
  size._0_4_ = loc_local.locale_._4_4_ >> 8 & 0xff;
  tVar3 = to_unsigned<int>(sign);
  sStack_50 = (size_t)(tVar3 + ((sign_t)size != none));
  if ((loc_local.locale_._4_4_ >> 0x11 & 1) == 0) {
    local_221 = '.';
  }
  else {
    stack0xffffffffffffffa0 = fp_local;
    local_221 = decimal_point<char8_t>((locale_ref)fp_local);
  }
  local_51 = local_221;
  use_exp_format.fspecs.precision = specs_local->precision + sign + -1;
  _abs_output_exp = (float_specs)loc_local.locale_;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar2 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char8_t,_fmt::v8::detail::digit_grouping<char8_t>_>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)&abs_output_exp);
  if (bVar2) {
    exp_digits = 0;
    if ((loc_local.locale_._4_4_ >> 0x14 & 1) == 0) {
      if (sign == minus) {
        local_51 = '\0';
      }
    }
    else {
      exp_digits = (int)loc_local.locale_ - sign;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      tVar3 = to_unsigned<int>(exp_digits);
      sStack_50 = tVar3 + sStack_50;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_228 = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_228 = use_exp_format.fspecs._4_4_;
    }
    write.output_exp = 2;
    if ((99 < local_228) && (write.output_exp = 3, 999 < local_228)) {
      write.output_exp = 4;
    }
    tVar3 = to_unsigned<int>((local_51 != '\0') + 2 + write.output_exp);
    fVar1 = fspecs_local;
    sStack_50 = tVar3 + sStack_50;
    local_229 = 0x45;
    if (((ulong)loc_local.locale_ & 0x1000000000000) == 0) {
      local_229 = 0x65;
    }
    write._23_1_ = local_229;
    local_9c._0_4_ = (sign_t)size;
    local_9c._4_4_ = sStack_3c;
    write.sign = sign;
    write.significand._0_1_ = local_51;
    write.significand_size = exp_digits;
    write.decimal_point = '0';
    write._13_1_ = local_229;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (_significand_size->width < 1) {
      pbVar5 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                         ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)&fspecs_local,
                          sStack_50);
      it = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char8_t,_fmt::v8::detail::digit_grouping<char8_t>_>
           ::anon_class_28_8_ad0ecca5::operator()
                     ((anon_class_28_8_ad0ecca5 *)local_9c,pbVar5->container);
      out_local = base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                            ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)fVar1,it);
    }
    else {
      out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                            ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)fspecs_local,
                             _significand_size,sStack_50,(anon_class_28_8_ad0ecca5 *)local_9c);
    }
  }
  else {
    grouping.sep_._36_4_ = specs_local->precision + sign;
    if (specs_local->precision < 0) {
      if ((int)grouping.sep_._36_4_ < 1) {
        local_1dc = -grouping.sep_._36_4_;
        if (((sign == none) && (-1 < (int)loc_local.locale_)) &&
           ((int)loc_local.locale_ < local_1dc)) {
          local_1dc = (int)loc_local.locale_;
        }
        local_271 = true;
        if ((local_1dc == 0) && (local_271 = true, sign == none)) {
          local_271 = (bool)((byte)(loc_local.locale_._4_4_ >> 0x14) & 1);
        }
        local_1dd = local_271;
        tVar3 = to_unsigned<int>(local_1dc);
        sStack_50 = ((local_271 != false) + 1 + tVar3) + sStack_50;
        local_1e8 = fspecs_local;
        local_220.sign = (sign_t *)&size;
        local_220.zero = (char8_t *)((long)&size + 7);
        local_220.pointy = &local_1dd;
        local_220.decimal_point = &local_51;
        local_220.num_zeros = &local_1dc;
        local_220.significand = &stack0xffffffffffffffc4;
        local_220.significand_size = (int *)&sign;
        out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_>
                              ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)fspecs_local
                               ,_significand_size,sStack_50,&local_220);
      }
      else {
        if ((loc_local.locale_._4_4_ >> 0x14 & 1) == 0) {
          local_24c = 0;
        }
        else {
          local_24c = (int)loc_local.locale_ - sign;
        }
        grouping_1.sep_._36_4_ = local_24c;
        if (local_24c < 1) {
          local_250 = 0;
        }
        else {
          local_250 = local_24c;
        }
        tVar3 = to_unsigned<int>(local_250);
        sStack_50 = sStack_50 + (tVar3 + 1);
        local_190 = fp_local;
        digit_grouping<char8_t>::digit_grouping
                  ((digit_grouping<char8_t> *)local_188,(locale_ref)fp_local,
                   (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
        iVar4 = digit_grouping<char8_t>::count_separators((digit_grouping<char8_t> *)local_188,sign)
        ;
        tVar3 = to_unsigned<int>(iVar4);
        sStack_50 = sStack_50 + tVar3;
        local_198 = fspecs_local;
        _auStack_1d8 = (sign_t *)&size;
        local_1d0 = &stack0xffffffffffffffc4;
        local_1c8 = &sign;
        local_1c0 = (int *)&grouping.sep_.field_0x24;
        local_1b8 = &local_51;
        local_1b0 = (digit_grouping<char8_t> *)local_188;
        local_1a8 = (int *)&grouping_1.sep_.field_0x24;
        local_1a0 = (char8_t *)((long)&size + 7);
        out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_>
                              ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)fspecs_local
                               ,_significand_size,sStack_50,(anon_class_64_8_e6ffa566 *)auStack_1d8)
        ;
        digit_grouping<char8_t>::~digit_grouping((digit_grouping<char8_t> *)local_188);
      }
    }
    else {
      tVar3 = to_unsigned<int>(specs_local->precision);
      sStack_50 = tVar3 + sStack_50;
      grouping.sep_._32_4_ = (int)loc_local.locale_ - grouping.sep_._36_4_;
      if ((loc_local.locale_._4_4_ >> 0x14 & 1) != 0) {
        if (((int)grouping.sep_._32_4_ < 1) && ((char)((ulong)loc_local.locale_ >> 0x20) != '\x02'))
        {
          grouping.sep_.thousands_sep = '\x01';
          grouping.sep_._33_3_ = 0;
        }
        if (0 < (int)grouping.sep_._32_4_) {
          tVar3 = to_unsigned<int>(grouping.sep_._32_4_);
          sStack_50 = (tVar3 + 1) + sStack_50;
        }
      }
      local_f8 = fp_local;
      digit_grouping<char8_t>::digit_grouping
                ((digit_grouping<char8_t> *)local_f0,(locale_ref)fp_local,
                 (bool)((byte)(loc_local.locale_._4_4_ >> 0x11) & 1));
      iVar4 = digit_grouping<char8_t>::count_separators((digit_grouping<char8_t> *)local_f0,sign);
      tVar3 = to_unsigned<int>(iVar4);
      sStack_50 = sStack_50 + tVar3;
      local_110 = fspecs_local;
      _auStack_158 = (sign_t *)&size;
      local_150 = &stack0xffffffffffffffc4;
      local_148 = &sign;
      local_140 = specs_local;
      local_138 = (digit_grouping<char8_t> *)local_f0;
      local_130 = &loc_local;
      local_128 = &local_51;
      local_120 = &grouping.sep_.thousands_sep;
      local_118 = (char8_t *)((long)&size + 7);
      out_local = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char8_t,fmt::v8::detail::digit_grouping<char8_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_>
                            ((back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)fspecs_local,
                             _significand_size,sStack_50,(anon_class_72_9_d68ba176 *)auStack_158);
      digit_grouping<char8_t>::~digit_grouping((digit_grouping<char8_t> *)local_f0);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}